

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

ScopedStmtBlock * __thiscall
kratos::SwitchStmt::add_switch_case
          (SwitchStmt *this,Const *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  ScopedStmtBlock *pSVar1;
  undefined1 local_30 [8];
  shared_ptr<kratos::Const> c;
  
  Var::as<kratos::Const>((Var *)local_30);
  pSVar1 = add_switch_case(this,(shared_ptr<kratos::Const> *)local_30,stmt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
  return pSVar1;
}

Assistant:

ScopedStmtBlock &SwitchStmt::add_switch_case(Const &switch_case,
                                             const std::shared_ptr<Stmt> &stmt) {
    auto c = switch_case.as<Const>();
    return add_switch_case(c, stmt);
}